

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackInterpreter::callPrimitiveHere(StackInterpreter *this,PrimitiveFunction primitive)

{
  size_t index;
  Oop value;
  undefined1 local_28 [8];
  StackInterpreterProxy proxy;
  PrimitiveFunction primitive_local;
  StackInterpreter *this_local;
  
  proxy.interpreter = (StackInterpreter *)primitive;
  StackInterpreterProxy::StackInterpreterProxy((StackInterpreterProxy *)local_28,this);
  this->primitiveHasFailed = false;
  (*(code *)proxy.interpreter)(local_28);
  if ((this->primitiveHasFailed & 1U) != 0) {
    index = this->argumentCount;
    value = Oop::encodeSmallInteger((long)this->primitiveErrorCode);
    setTemporary(this,index,value);
  }
  return;
}

Assistant:

void callPrimitiveHere(PrimitiveFunction primitive)
    {
        StackInterpreterProxy proxy(this);

        // Reset the has failed flag.
        primitiveHasFailed = false;
        primitive(&proxy);

        // If the primitive has failed, store the error code in the first temporary.
        if(primitiveHasFailed)
            setTemporary(argumentCount, Oop::encodeSmallInteger(primitiveErrorCode));
    }